

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc_ball.cpp
# Opt level: O0

vec3 __thiscall lumeview::ArcBall::get_ball_point_from_frame_coords(ArcBall *this,vec2 *c)

{
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 aVar1;
  float fVar2;
  float scale;
  float mag;
  vec2 *c_local;
  ArcBall *this_local;
  float fStack_10;
  vec3 p;
  
  glm::tvec3<float,_(glm::precision)0>::tvec3
            ((tvec3<float,_(glm::precision)0> *)((long)&this_local + 4));
  this_local._4_4_ =
       (((c->field_0).field_0.x - (this->m_offset).field_0.field_0.x) -
       (this->m_frame).field_0.field_0.x / 2.0) /
       ((this->m_radius * (this->m_frame).field_0.field_0.x) / 2.0);
  fStack_10 = (((c->field_0).field_0.y - (this->m_offset).field_0.field_0.y) -
              (this->m_frame).field_0.field_0.y / 2.0) /
              ((this->m_radius * (this->m_frame).field_0.field_0.y) / 2.0);
  p.field_0.field_0.x = 0.0;
  fVar2 = this_local._4_4_ * this_local._4_4_ + fStack_10 * fStack_10;
  if (fVar2 <= 1.0) {
    p.field_0.field_0.x = sqrtf(1.0 - fVar2);
  }
  else {
    fVar2 = sqrtf(fVar2);
    this_local._4_4_ = (1.0 / fVar2) * this_local._4_4_;
    fStack_10 = (1.0 / fVar2) * fStack_10;
  }
  aVar1.field_0.y = fStack_10;
  aVar1.field_0.x = this_local._4_4_;
  aVar1.field_0.z = p.field_0.field_0.x;
  return (anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2)
         (anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2)aVar1.field_0;
}

Assistant:

glm::vec3 ArcBall::get_ball_point_from_frame_coords(const glm::vec2& c) const
{
    vec3 p;
    p.x   = (c.x - m_offset.x - m_frame.x / 2.f) / (m_radius * m_frame.x / 2.f);
    p.y   = (c.y - m_offset.y - m_frame.y / 2.f) / (m_radius * m_frame.y / 2.f);
    p.z   = 0.0f;

    const float mag = p.x * p.x + p.y * p.y;

    if (mag > 1.0f) {
        float scale = 1.0f / sqrtf (mag);
        p.x *= scale;
        p.y *= scale;
    }
    else
        p.z = sqrtf (1.0f - mag);

    return p;
}